

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromScene(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  Float radius;
  float fVar1;
  uint uVar2;
  LensElementInterface *pLVar3;
  LensElementInterface *pLVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  size_t i;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 extraout_var [60];
  undefined1 auVar11 [64];
  undefined1 auVar14 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  Point3f PVar16;
  Vector3<float> VVar17;
  Float t;
  Transform LensFromCamera;
  float local_148;
  float local_144;
  Vector3f local_140;
  Ray local_130;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  Ray *local_e8;
  Tuple3<pbrt::Vector3,_float> local_e0;
  Tuple3<pbrt::Vector3,_float> local_d0;
  Tuple3<pbrt::Normal3,_float> local_c0;
  Transform local_b0;
  
  local_e8 = rOut;
  auVar11._0_4_ = LensFrontZ(this);
  auVar11._4_60_ = extraout_var;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  local_f8 = vxorps_avx512vl(auVar11._0_16_,auVar5);
  Scale(&local_b0,1.0,1.0,-1.0);
  lVar9 = 0;
  Transform::operator()(&local_130,&local_b0,rCamera,(Float *)0x0);
  uVar8 = 0;
  while( true ) {
    if ((this->elementInterfaces).nStored <= uVar8) {
      if (local_e8 != (Ray *)0x0) {
        (local_e8->o).super_Tuple3<pbrt::Point3,_float>.x =
             local_130.o.super_Tuple3<pbrt::Point3,_float>.x;
        (local_e8->o).super_Tuple3<pbrt::Point3,_float>.y =
             local_130.o.super_Tuple3<pbrt::Point3,_float>.y;
        (local_e8->o).super_Tuple3<pbrt::Point3,_float>.z =
             -local_130.o.super_Tuple3<pbrt::Point3,_float>.z;
        (local_e8->d).super_Tuple3<pbrt::Vector3,_float>.x =
             local_130.d.super_Tuple3<pbrt::Vector3,_float>.x;
        (local_e8->d).super_Tuple3<pbrt::Vector3,_float>.y =
             local_130.d.super_Tuple3<pbrt::Vector3,_float>.y;
        (local_e8->d).super_Tuple3<pbrt::Vector3,_float>.z =
             -local_130.d.super_Tuple3<pbrt::Vector3,_float>.z;
        local_e8->time = local_130.time;
        (local_e8->medium).
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = 0;
      }
      return 1.0;
    }
    pLVar3 = (this->elementInterfaces).ptr;
    local_c0.x = 0.0;
    local_c0.y = 0.0;
    local_c0.z = 0.0;
    radius = *(Float *)((long)&pLVar3->curvatureRadius + lVar9);
    local_108._0_4_ = radius;
    if ((radius != 0.0) || (NAN(radius))) {
      bVar7 = IntersectSphericalElement
                        (radius,(float)local_f8._0_4_ + radius,&local_130,&local_148,
                         (Normal3f *)&local_c0);
      if (!bVar7) {
        return 0.0;
      }
      auVar11 = ZEXT464((uint)local_148);
    }
    else {
      local_148 = ((float)local_f8._0_4_ - local_130.o.super_Tuple3<pbrt::Point3,_float>.z) /
                  local_130.d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar11 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),local_148));
      if (local_148 < 0.0) {
        return 0.0;
      }
    }
    auVar14 = auVar11._8_56_;
    PVar16 = Ray::operator()(&local_130,auVar11._0_4_);
    local_130.o.super_Tuple3<pbrt::Point3,_float>.z = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
    auVar12._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar14;
    fVar1 = *(float *)((long)&pLVar3->apertureRadius + lVar9);
    auVar10 = auVar12._0_16_;
    auVar15._0_4_ =
         PVar16.super_Tuple3<pbrt::Point3,_float>.x * PVar16.super_Tuple3<pbrt::Point3,_float>.x;
    auVar15._4_4_ =
         PVar16.super_Tuple3<pbrt::Point3,_float>.y * PVar16.super_Tuple3<pbrt::Point3,_float>.y;
    auVar15._8_4_ = auVar14._0_4_ * auVar14._0_4_;
    auVar15._12_4_ = auVar14._4_4_ * auVar14._4_4_;
    auVar5 = vmovshdup_avx(auVar15);
    auVar5 = vfmadd231ss_fma(auVar5,auVar10,auVar10);
    if (fVar1 * fVar1 < auVar5._0_4_) break;
    local_130.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar10);
    if (((float)local_108._0_4_ != 0.0) || (NAN((float)local_108._0_4_))) {
      local_140.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      local_140.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      local_140.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      pLVar4 = (this->elementInterfaces).ptr;
      local_144 = 1.0;
      if (uVar8 != 0) {
        fVar1 = *(float *)((long)pLVar4 + lVar9 + -8);
        if ((fVar1 != 0.0) || (local_144 = 1.0, NAN(fVar1))) {
          local_144 = fVar1;
        }
      }
      uVar2 = *(uint *)((long)&pLVar4->eta + lVar9);
      uVar6 = vcmpss_avx512f(ZEXT416(uVar2),ZEXT816(0) << 0x20,4);
      bVar7 = (bool)((byte)uVar6 & 1);
      local_108 = ZEXT416(bVar7 * uVar2 + (uint)!bVar7 * 0x3f800000);
      auVar10._0_8_ = local_130.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
      auVar10._8_4_ = 0x80000000;
      auVar10._12_4_ = 0x80000000;
      auVar14 = ZEXT856(auVar10._8_8_);
      local_e0.z = -local_130.d.super_Tuple3<pbrt::Vector3,_float>.z;
      local_e0._0_8_ = vmovlps_avx(auVar10);
      VVar17 = Normalize<float>((Vector3<float> *)&local_e0);
      local_d0.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar14;
      local_d0._0_8_ = vmovlps_avx(auVar13._0_16_);
      bVar7 = Refract((Vector3f *)&local_d0,(Normal3f *)&local_c0,(float)local_108._0_4_ / local_144
                      ,&local_140);
      if (!bVar7) {
        return 0.0;
      }
      local_130.d.super_Tuple3<pbrt::Vector3,_float>.z =
           local_140.super_Tuple3<pbrt::Vector3,_float>.z;
      local_130.d.super_Tuple3<pbrt::Vector3,_float>.x =
           local_140.super_Tuple3<pbrt::Vector3,_float>.x;
      local_130.d.super_Tuple3<pbrt::Vector3,_float>.y =
           local_140.super_Tuple3<pbrt::Vector3,_float>.y;
    }
    uVar8 = uVar8 + 1;
    local_f8._0_4_ = (float)local_f8._0_4_ + *(float *)((long)&pLVar3->thickness + lVar9);
    local_f8._4_4_ = 0;
    local_f8._8_4_ = 0;
    local_f8._12_4_ = 0;
    lVar9 = lVar9 + 0x10;
  }
  return 0.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromScene(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = -LensFrontZ();
    // Transform _rCamera_ from camera to lens system space
    const Transform LensFromCamera = Scale(1, 1, -1);
    Ray rLens = LensFromCamera(rCamera);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;
        } else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }

        // Test intersection point against element aperture
        // Don't worry about the aperture image here.
        Point3f pHit = rLens(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (r2 > element.apertureRadius * element.apertureRadius)
            return 0;
        rLens.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0)
                              ? 1
                              : elementInterfaces[i - 1].eta;
            Float eta_t = (elementInterfaces[i].eta != 0) ? elementInterfaces[i].eta : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &wt))
                return 0;
            rLens.d = wt;
        }
        elementZ += element.thickness;
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);
    return 1;
}